

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O3

void __thiscall Electron::VideoOutput::setup_screen_map(VideoOutput *this)

{
  vector<Electron::VideoOutput::DrawAction,_std::allocator<Electron::VideoOutput::DrawAction>_>
  *this_00;
  Type *__args;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int local_38 [2];
  
  this_00 = &this->screen_map_;
  __args = (Type *)(local_38 + 1);
  bVar2 = true;
  do {
    bVar1 = bVar2;
    if (bVar1) {
      local_38[0] = 0x40;
      local_38[1] = 2;
      std::
      vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>::
      emplace_back<Electron::VideoOutput::DrawAction::Type,int>
                ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
                  *)this_00,__args,local_38);
      local_38[0] = 0x140;
      local_38[1] = 0;
    }
    else {
      local_38[0] = 0x140;
      local_38[1] = 0;
      std::
      vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>::
      emplace_back<Electron::VideoOutput::DrawAction::Type,int>
                ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
                  *)this_00,__args,local_38);
      local_38[0] = 0x40;
      local_38[1] = 2;
    }
    std::vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
    ::emplace_back<Electron::VideoOutput::DrawAction::Type,int>
              ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
                *)this_00,__args,local_38);
    iVar3 = 0x1c;
    do {
      emplace_blank_line(this);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    iVar3 = 0x100;
    do {
      emplace_pixel_line(this);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    iVar3 = 0x19;
    do {
      emplace_blank_line(this);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    bVar2 = false;
  } while (bVar1);
  emplace_blank_line(this);
  return;
}

Assistant:

void VideoOutput::setup_screen_map() {
	/*

		Odd field:					Even field:

		|--S--|						   -S-|
		|--S--|						|--S--|
		|-S-B-|	= 3					|--S--| = 2.5
		|--B--|						|--B--|
		|--P--|						|--P--|
		|--B--| = 312				|--B--| = 312.5
		|-B-

	*/
	for(int c = 0; c < 2; c++) {
		if(c&1) {
			screen_map_.emplace_back(DrawAction::Sync, (cycles_per_line * 5) >> 1);
			screen_map_.emplace_back(DrawAction::Blank, cycles_per_line >> 1);
		} else {
			screen_map_.emplace_back(DrawAction::Blank, cycles_per_line >> 1);
			screen_map_.emplace_back(DrawAction::Sync, (cycles_per_line * 5) >> 1);
		}
		for(int l = 0; l < first_graphics_line - 3; l++) emplace_blank_line();
		for(int l = 0; l < 256; l++) emplace_pixel_line();
		for(int l = 256 + first_graphics_line; l < 312; l++) emplace_blank_line();
		if(c&1) emplace_blank_line();
	}
}